

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateOptions
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  string *_longName;
  ulong uVar1;
  value_type *__x;
  pointer pAVar2;
  IArgFunction<Catch::ConfigData> *pIVar3;
  bool bVar4;
  pointer pbVar5;
  bool bVar6;
  pointer pTVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  runtime_error *this_00;
  pointer pAVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  ostringstream oss;
  ulong local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_250;
  CommandLine<Catch::ConfigData> *local_240;
  ConfigData *local_238;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_230;
  string local_208 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar7 = (tokens->
           super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_250 = __return_storage_ptr__;
  local_240 = this;
  local_238 = config;
  local_230 = tokens;
  if ((tokens->
      super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>)
      ._M_impl.super__Vector_impl_data._M_finish != pTVar7) {
    local_270 = 0;
    do {
      __x = pTVar7 + local_270;
      pAVar9 = (local_240->m_options).
               super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar2 = (local_240->m_options).
               super__Vector_base<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pAVar9 != pAVar2) {
        _longName = &__x->data;
        do {
          if (((__x->type == ShortOpt) &&
              (_Var8 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 ((pAVar9->super_OptionArgProperties).shortNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pAVar9->super_OptionArgProperties).shortNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,_longName),
              _Var8._M_current !=
              (pAVar9->super_OptionArgProperties).shortNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) ||
             ((bVar4 = true, __x->type == LongOpt &&
              (bVar6 = OptionArgProperties::hasLongName
                                 (&pAVar9->super_OptionArgProperties,_longName), bVar6)))) {
            if ((pAVar9->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_string_length
                == 0) {
              pIVar3 = (pAVar9->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj
              ;
              (*pIVar3->_vptr_IArgFunction[3])(pIVar3,local_238);
            }
            else {
              pTVar7 = (local_230->
                       super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((local_270 !=
                   ((long)(local_230->
                          super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 3) *
                   -0x3333333333333333 - 1U) &&
                 (uVar1 = local_270 + 1, pTVar7[uVar1].type == Positional)) {
                pIVar3 = (pAVar9->super_CommonArgProperties<Catch::ConfigData>).boundField.
                         functionObj;
                (*pIVar3->_vptr_IArgFunction[2])(pIVar3,local_238,&pTVar7[uVar1].data);
                bVar4 = false;
                local_270 = uVar1;
                goto LAB_00124f11;
              }
              std::operator+(local_1a8,"Expected argument to option: ",_longName);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_268,local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                operator_delete(local_1a8[0]._M_dataplus._M_p);
              }
            }
            bVar4 = false;
          }
LAB_00124f11:
        } while ((bVar4) && (pAVar9 = pAVar9 + 1, pAVar9 != pAVar2));
      }
      if (pAVar9 == pAVar2) {
        if ((__x->type == Positional) || (local_240->m_throwOnUnrecognisedTokens == false)) {
          std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
          push_back(local_250,__x);
        }
        else if (local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_268.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+(local_1a8,"unrecognised option: ",&__x->data);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268
                     ,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p);
          }
        }
      }
      local_270 = local_270 + 1;
      pTVar7 = (local_230->
               super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (local_270 <
             (ulong)(((long)(local_230->
                            super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 3) *
                    -0x3333333333333333));
  }
  if (local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pbVar5 = local_268.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_268.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar10 = local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pbVar10 !=
            local_268.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != pbVar5);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,local_208);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  return local_250;
}

Assistant:

std::vector<Parser::Token> populateOptions( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            std::vector<std::string> errors;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::vector<Arg>::const_iterator it = m_options.begin(), itEnd = m_options.end();
                for(; it != itEnd; ++it ) {
                    Arg const& arg = *it;

                    try {
                        if( ( token.type == Parser::Token::ShortOpt && arg.hasShortName( token.data ) ) ||
                            ( token.type == Parser::Token::LongOpt && arg.hasLongName( token.data ) ) ) {
                            if( arg.takesArg() ) {
                                if( i == tokens.size()-1 || tokens[i+1].type != Parser::Token::Positional )
                                    errors.push_back( "Expected argument to option: " + token.data );
                                else
                                    arg.boundField.set( config, tokens[++i].data );
                            }
                            else {
                                arg.boundField.setFlag( config );
                            }
                            break;
                        }
                    }
                    catch( std::exception& ex ) {
                        errors.push_back( std::string( ex.what() ) + "\n- while parsing: (" + arg.commands() + ")" );
                    }
                }
                if( it == itEnd ) {
                    if( token.type == Parser::Token::Positional || !m_throwOnUnrecognisedTokens )
                        unusedTokens.push_back( token );
                    else if( errors.empty() && m_throwOnUnrecognisedTokens )
                        errors.push_back( "unrecognised option: " + token.data );
                }
            }
            if( !errors.empty() ) {
                std::ostringstream oss;
                for( std::vector<std::string>::const_iterator it = errors.begin(), itEnd = errors.end();
                        it != itEnd;
                        ++it ) {
                    if( it != errors.begin() )
                        oss << "\n";
                    oss << *it;
                }
                throw std::runtime_error( oss.str() );
            }
            return unusedTokens;
        }